

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglwindow.cpp
# Opt level: O0

void __thiscall QOpenGLWindow::resizeEvent(QOpenGLWindow *this,QResizeEvent *event)

{
  int iVar1;
  int iVar2;
  QWindow *in_RDI;
  QOpenGLWindowPrivate *d;
  
  d_func((QOpenGLWindow *)0x1b6cf0);
  QOpenGLWindowPrivate::initialize((QOpenGLWindowPrivate *)this);
  iVar1 = QWindow::width(in_RDI);
  iVar2 = QWindow::height(in_RDI);
  (**(code **)(*(long *)in_RDI + 0x140))(in_RDI,iVar1,iVar2);
  return;
}

Assistant:

void QOpenGLWindow::resizeEvent(QResizeEvent *event)
{
    Q_UNUSED(event);
    Q_D(QOpenGLWindow);
    d->initialize();
    resizeGL(width(), height());
}